

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

void rprog_elven_down_end(CHAR_DATA *ch,AFFECT_DATA *af)

{
  ROOM_INDEX_DATA *arg2;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  ROOM_INDEX_DATA *to_room;
  ROOM_INDEX_DATA *in_stack_00000018;
  CHAR_DATA *in_stack_00000020;
  CHAR_DATA *in_stack_00000040;
  
  arg2 = get_room_index((int)((ulong)in_RDI >> 0x20));
  char_from_room(in_stack_00000040);
  char_to_room(in_stack_00000020,in_stack_00000018);
  act((char *)to_room,in_RDI,in_RSI,arg2,0);
  act((char *)to_room,in_RDI,in_RSI,arg2,0);
  return;
}

Assistant:

void rprog_elven_down_end(CHAR_DATA *ch, AFFECT_DATA *af)
{
	ROOM_INDEX_DATA *to_room = nullptr;

	to_room = get_room_index(4704);

	char_from_room(ch);
	char_to_room(ch, to_room);

	act("You feel the floor drop beneath you, and you feel yourself fall and then impact as you hit the ground.", ch, 0, 0, TO_CHAR);
	act("$n appears out of thin air, crumpling in to the ground with a thud.", ch, 0, 0, TO_ROOM);
}